

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O3

llb_build_key_t * llb_build_key_make(llb_data_t *data)

{
  CAPIBuildKey *this;
  long *local_60 [2];
  long local_50 [2];
  BuildKey local_40;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,data->data,data->data + data->length);
  llbuild::buildsystem::BuildKey::fromData(&local_40,(KeyType *)local_60);
  anon_unknown.dwarf_2bd53f::CAPIBuildKey::CAPIBuildKey(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.key.key._M_dataplus._M_p != &local_40.key.key.field_2) {
    operator_delete(local_40.key.key._M_dataplus._M_p,
                    local_40.key.key.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make(const llb_data_t *data) {
  return (llb_build_key_t *)new CAPIBuildKey(
    BuildKey::fromData(core::KeyType(
      reinterpret_cast<const char*>(data->data), static_cast<size_t>(data->length)
    ))
  );
}